

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O1

void __thiscall
MaterialSystemTest_testIntProperty_Test::TestBody(MaterialSystemTest_testIntProperty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  int pf;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  int local_24;
  
  local_24 = 0xe57b1f;
  aiMaterial::AddBinaryProperty
            ((this->super_MaterialSystemTest).pcMat,&local_24,4,"testKey3",0,0,aiPTI_Integer);
  local_24 = 0xc;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  local_40.data_._0_4_ =
       aiGetMaterialIntegerArray
                 ((this->super_MaterialSystemTest).pcMat,"testKey3",0,0,&local_24,(uint *)0x0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_38,"aiReturn_SUCCESS","pcMat->Get(\"testKey3\",0,0,pf)",(aiReturn *)&local_48,
             (aiReturn *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_4_ = 0xe57b1f;
  testing::internal::CmpHelperEQ<int,int>(local_38,"15039263","pf",(int *)&local_48,&local_24);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testIntProperty)
{
    int pf = 15039263;
    this->pcMat->AddProperty(&pf,1,"testKey3");
    pf = 12;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey3",0,0,pf));
    EXPECT_EQ(15039263, pf);
}